

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::
FormatForComparisonFailureMessage<test::spi_test::TestObjectX,test::spi_test::TestObjectX>
          (string *__return_storage_ptr__,internal *this,TestObjectX *value,TestObjectX *param_2)

{
  TestObjectX *param_1_local;
  TestObjectX *value_local;
  
  PrintToString<test::spi_test::TestObjectX>(__return_storage_ptr__,(TestObjectX *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}